

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

float basisu::srgb_to_linear(float s)

{
  float in_XMM0_Da;
  float local_4;
  
  if (in_XMM0_Da < 0.0 || 1.0 < in_XMM0_Da) {
    __assert_fail("s >= 0.0f && s <= 1.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x25d,"float basisu::srgb_to_linear(float)");
  }
  if (0.04045 <= in_XMM0_Da) {
    powf((in_XMM0_Da + 0.055) * 0.94786733,2.4);
    local_4 = saturate(0.0);
  }
  else {
    local_4 = saturate(0.0);
  }
  return local_4;
}

Assistant:

float srgb_to_linear(float s)
	{
		assert(s >= 0.0f && s <= 1.0f);
		if (s < .04045f)
			return saturate(s * (1.0f/12.92f));
		else
			return saturate(powf((s + .055f) * (1.0f/1.055f), 2.4f));
	}